

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O3

int physics_thread_main(void *arg)

{
  undefined8 uVar1;
  float fVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  float dt;
  float fVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  timespec ts;
  timespec local_40;
  
  do {
    mtx_lock(&thread_sync.particles_lock);
    while ((iVar4 = glfwWindowShouldClose((GLFWwindow *)arg), iVar4 == 0 &&
           (thread_sync.d_frame < thread_sync.p_frame))) {
      clock_gettime(0,&local_40);
      local_40.tv_nsec = local_40.tv_nsec + 100000000;
      cnd_timedwait(&thread_sync.d_done,&thread_sync.particles_lock,(timespec *)&local_40);
    }
    iVar4 = glfwWindowShouldClose((GLFWwindow *)arg);
    dVar3 = thread_sync.t;
    fVar2 = thread_sync.dt;
    if (iVar4 != 0) {
      return 0;
    }
    for (; 0.0 < fVar2; fVar2 = fVar2 - dt) {
      dt = fVar2;
      if (0.0013333333 <= fVar2) {
        dt = 0.0013333333;
      }
      lVar6 = 0;
      do {
        update_particle((PARTICLE *)((long)&particles[0].x + lVar6),dt);
        lVar6 = lVar6 + 0x2c;
      } while (lVar6 != 0x203a0);
      min_age = min_age + dt;
      fVar7 = min_age;
joined_r0x001070f7:
      if (0.0026666666 <= fVar7) {
        min_age = fVar7 + -0.0026666666;
        lVar6 = 0;
        do {
          if (*(int *)((long)&particles[0].active + lVar6) == 0) {
            dVar8 = (double)min_age + dVar3;
            *(undefined8 *)((long)&particles[0].x + lVar6) = 0;
            *(undefined4 *)((long)&particles[0].z + lVar6) = 0x40400000;
            uVar5 = rand();
            *(float *)((long)&particles[0].vz + lVar6) = (float)(uVar5 & 0xfff) * 7.324219e-05 + 0.7
            ;
            uVar5 = rand();
            dVar9 = (double)((float)(uVar5 & 0xfff) * 0.0015339808);
            dVar10 = cos(dVar9);
            *(float *)((long)&particles[0].vx + lVar6) = (float)dVar10 * 0.4;
            dVar9 = sin(dVar9);
            *(float *)((long)&particles[0].vy + lVar6) = (float)dVar9 * 0.4;
            dVar9 = sin(dVar8 * 0.5);
            dVar10 = sin(dVar8 * 1.31);
            fVar7 = ((float)(dVar10 + dVar9) * 0.1 + 0.8) * 8.0;
            uVar1 = *(undefined8 *)((long)&particles[0].vx + lVar6);
            *(ulong *)((long)&particles[0].vx + lVar6) =
                 CONCAT44(fVar7 * (float)((ulong)uVar1 >> 0x20),fVar7 * (float)uVar1);
            *(float *)((long)&particles[0].vz + lVar6) =
                 fVar7 * *(float *)((long)&particles[0].vz + lVar6);
            dVar9 = sin(dVar8 * 0.34 + 0.1);
            *(float *)((long)&particles[0].r + lVar6) = (float)dVar9 * 0.3 + 0.7;
            dVar9 = sin(dVar8 * 0.63 + 1.1);
            *(float *)((long)&particles[0].g + lVar6) = (float)dVar9 * 0.4 + 0.6;
            dVar9 = sin(dVar8 * 0.91 + 2.1);
            *(float *)((long)&particles[0].b + lVar6) = (float)dVar9 * 0.4 + 0.6;
            dVar9 = sin(dVar8 * 1.34);
            glow_pos[0] = (float)dVar9 * 0.4;
            dVar8 = sin(dVar8 * 3.11);
            glow_pos[1] = (float)dVar8 * 0.4;
            glow_pos[2] = 4.0;
            glow_pos[3] = 1.0;
            glow_color._0_8_ = *(undefined8 *)((long)&particles[0].r + lVar6);
            glow_color[2] = *(float *)((long)&particles[0].b + lVar6);
            glow_color[3] = 1.0;
            *(undefined8 *)((long)&particles[0].life + lVar6) = 0x13f800000;
            fVar7 = min_age;
            update_particle((PARTICLE *)((long)&particles[0].x + lVar6),min_age);
            break;
          }
          lVar6 = lVar6 + 0x2c;
          fVar7 = min_age;
        } while (lVar6 != 0x203a0);
        goto joined_r0x001070f7;
      }
    }
    thread_sync.p_frame = thread_sync.p_frame + 1;
    mtx_unlock(&thread_sync.particles_lock);
    cnd_signal(&thread_sync.p_done);
  } while( true );
}

Assistant:

static int physics_thread_main(void* arg)
{
    GLFWwindow* window = arg;

    for (;;)
    {
        mtx_lock(&thread_sync.particles_lock);

        // Wait for particle drawing to be done
        while (!glfwWindowShouldClose(window) &&
               thread_sync.p_frame > thread_sync.d_frame)
        {
            struct timespec ts;
            clock_gettime(CLOCK_REALTIME, &ts);
            ts.tv_nsec += 100000000;
            cnd_timedwait(&thread_sync.d_done, &thread_sync.particles_lock, &ts);
        }

        if (glfwWindowShouldClose(window))
            break;

        // Update particles
        particle_engine(thread_sync.t, thread_sync.dt);

        // Update frame counter
        thread_sync.p_frame++;

        // Unlock mutex and signal drawing thread
        mtx_unlock(&thread_sync.particles_lock);
        cnd_signal(&thread_sync.p_done);
    }

    return 0;
}